

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xsd_generator.cc
# Opt level: O0

void __thiscall
t_xsd_generator::generate_element
          (t_xsd_generator *this,ostream *out,string *name,t_type *ttype,t_struct *attrs,
          bool optional,bool nillable,bool list_element)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  ostream *poVar4;
  reference pptVar5;
  string *psVar6;
  t_type *ptVar7;
  char local_229;
  string local_228;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_208
  ;
  t_field **local_200;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_1f8
  ;
  const_iterator a_iter_1;
  vector<t_field_*,_std::allocator<t_field_*>_> *members_1;
  string local_1c8;
  string local_1a8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_188
  ;
  t_field **local_180;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_178
  ;
  const_iterator a_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  t_type *local_108;
  t_type *subtype;
  string subname;
  string local_d8 [8];
  string snillable;
  string soptional;
  undefined1 local_90 [8];
  string smaxOccurs;
  allocator local_59;
  undefined1 local_58 [8];
  string sminOccurs;
  bool list_element_local;
  bool nillable_local;
  bool optional_local;
  t_struct *attrs_local;
  t_type *ttype_local;
  string *name_local;
  ostream *out_local;
  t_xsd_generator *this_local;
  
  sminOccurs.field_2._M_local_buf[0xe] = nillable;
  sminOccurs.field_2._M_local_buf[0xd] = list_element;
  local_229 = '\x01';
  if (!optional) {
    local_229 = list_element;
  }
  pcVar3 = "";
  if (local_229 != '\0') {
    pcVar3 = " minOccurs=\"0\"";
  }
  sminOccurs.field_2._M_local_buf[0xf] = optional;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_58,pcVar3,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pcVar3 = "";
  if ((sminOccurs.field_2._M_local_buf[0xd] & 1U) != 0) {
    pcVar3 = " maxOccurs=\"unbounded\"";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_90,pcVar3,(allocator *)(soptional.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(soptional.field_2._M_local_buf + 0xf));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&snillable.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
  pcVar3 = "";
  if ((sminOccurs.field_2._M_local_buf[0xe] & 1U) != 0) {
    pcVar3 = " nillable=\"true\"";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,pcVar3,(allocator *)(subname.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(subname.field_2._M_local_buf + 0xf));
  uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[4])();
  if (((uVar2 & 1) == 0) && (uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(), (uVar2 & 1) == 0))
  {
    if (attrs == (t_struct *)0x0) {
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      poVar4 = std::operator<<(poVar4,"<xsd:element name=\"");
      poVar4 = std::operator<<(poVar4,(string *)name);
      poVar4 = std::operator<<(poVar4,"\"");
      poVar4 = std::operator<<(poVar4," type=\"");
      type_name_abi_cxx11_(&local_1c8,this,ttype);
      poVar4 = std::operator<<(poVar4,(string *)&local_1c8);
      poVar4 = std::operator<<(poVar4,"\"");
      poVar4 = std::operator<<(poVar4,(string *)(snillable.field_2._M_local_buf + 8));
      poVar4 = std::operator<<(poVar4,local_d8);
      poVar4 = std::operator<<(poVar4," />");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    else {
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      poVar4 = std::operator<<(poVar4,"<xsd:element name=\"");
      poVar4 = std::operator<<(poVar4,(string *)name);
      poVar4 = std::operator<<(poVar4,"\"");
      poVar4 = std::operator<<(poVar4,(string *)(snillable.field_2._M_local_buf + 8));
      poVar4 = std::operator<<(poVar4,local_d8);
      poVar4 = std::operator<<(poVar4,">");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up(&this->super_t_generator);
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      poVar4 = std::operator<<(poVar4,"<xsd:complexType>");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up(&this->super_t_generator);
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      poVar4 = std::operator<<(poVar4,"<xsd:complexContent>");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up(&this->super_t_generator);
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      poVar4 = std::operator<<(poVar4,"<xsd:extension base=\"");
      type_name_abi_cxx11_((string *)&members_1,this,ttype);
      poVar4 = std::operator<<(poVar4,(string *)&members_1);
      poVar4 = std::operator<<(poVar4,"\">");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&members_1);
      t_generator::indent_up(&this->super_t_generator);
      a_iter_1._M_current = (t_field **)t_struct::get_members(attrs);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      __normal_iterator(&local_1f8);
      local_200 = (t_field **)
                  std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(a_iter_1._M_current);
      local_1f8._M_current = local_200;
      while( true ) {
        local_208._M_current =
             (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::end(a_iter_1._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_1f8,&local_208);
        if (!bVar1) break;
        poVar4 = t_generator::indent(&this->super_t_generator,out);
        poVar4 = std::operator<<(poVar4,"<xsd:attribute name=\"");
        pptVar5 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_1f8);
        psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
        poVar4 = std::operator<<(poVar4,(string *)psVar6);
        poVar4 = std::operator<<(poVar4,"\" type=\"");
        pptVar5 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_1f8);
        ptVar7 = t_field::get_type(*pptVar5);
        type_name_abi_cxx11_(&local_228,this,ptVar7);
        poVar4 = std::operator<<(poVar4,(string *)&local_228);
        poVar4 = std::operator<<(poVar4,"\" />");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_228);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_1f8);
      }
      t_generator::indent_down(&this->super_t_generator);
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      poVar4 = std::operator<<(poVar4,"</xsd:extension>");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_down(&this->super_t_generator);
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      poVar4 = std::operator<<(poVar4,"</xsd:complexContent>");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_down(&this->super_t_generator);
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      poVar4 = std::operator<<(poVar4,"</xsd:complexType>");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_down(&this->super_t_generator);
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      poVar4 = std::operator<<(poVar4,"</xsd:element>");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    poVar4 = std::operator<<(poVar4,"<xsd:element name=\"");
    poVar4 = std::operator<<(poVar4,(string *)name);
    poVar4 = std::operator<<(poVar4,"\"");
    poVar4 = std::operator<<(poVar4,(string *)(snillable.field_2._M_local_buf + 8));
    poVar4 = std::operator<<(poVar4,local_d8);
    poVar4 = std::operator<<(poVar4,">");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up(&this->super_t_generator);
    if ((attrs == (t_struct *)0x0) &&
       (uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[4])(), (uVar2 & 1) != 0)) {
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      poVar4 = std::operator<<(poVar4,"<xsd:complexType />");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    else {
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      poVar4 = std::operator<<(poVar4,"<xsd:complexType>");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up(&this->super_t_generator);
      uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar2 & 1) != 0) {
        poVar4 = t_generator::indent(&this->super_t_generator,out);
        poVar4 = std::operator<<(poVar4,"<xsd:sequence minOccurs=\"0\" maxOccurs=\"unbounded\">");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_up(&this->super_t_generator);
        std::__cxx11::string::string((string *)&subtype);
        local_108 = t_list::get_elem_type((t_list *)ttype);
        uVar2 = (*(local_108->super_t_doc)._vptr_t_doc[5])();
        if (((uVar2 & 1) == 0) &&
           (uVar2 = (*(local_108->super_t_doc)._vptr_t_doc[0xd])(), (uVar2 & 1) == 0)) {
          type_name_abi_cxx11_(&local_148,this,local_108);
          std::__cxx11::string::operator=((string *)&subtype,(string *)&local_148);
          std::__cxx11::string::~string((string *)&local_148);
        }
        else {
          std::operator+(&local_128,name,"_elt");
          std::__cxx11::string::operator=((string *)&subtype,(string *)&local_128);
          std::__cxx11::string::~string((string *)&local_128);
        }
        poVar4 = std::operator<<((ostream *)&this->f_php_,"$GLOBALS[\'");
        psVar6 = t_program::get_name_abi_cxx11_((this->super_t_generator).program_);
        poVar4 = std::operator<<(poVar4,(string *)psVar6);
        poVar4 = std::operator<<(poVar4,"_xsd_elt_");
        poVar4 = std::operator<<(poVar4,(string *)name);
        poVar4 = std::operator<<(poVar4,"\'] = \'");
        poVar4 = std::operator<<(poVar4,(string *)&subtype);
        poVar4 = std::operator<<(poVar4,"\';");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::string((string *)&members,(string *)&subtype);
        generate_element(this,out,(string *)&members,local_108,(t_struct *)0x0,false,false,true);
        std::__cxx11::string::~string((string *)&members);
        t_generator::indent_down(&this->super_t_generator);
        poVar4 = t_generator::indent(&this->super_t_generator,out);
        poVar4 = std::operator<<(poVar4,"</xsd:sequence>");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        poVar4 = t_generator::indent(&this->super_t_generator,out);
        poVar4 = std::operator<<(poVar4,"<xsd:attribute name=\"list\" type=\"xsd:boolean\" />");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&subtype);
      }
      if (attrs != (t_struct *)0x0) {
        a_iter._M_current = (t_field **)t_struct::get_members(attrs);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        __normal_iterator(&local_178);
        local_180 = (t_field **)
                    std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(a_iter._M_current);
        local_178._M_current = local_180;
        while( true ) {
          local_188._M_current =
               (t_field **)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::end(a_iter._M_current);
          bVar1 = __gnu_cxx::operator!=(&local_178,&local_188);
          if (!bVar1) break;
          poVar4 = t_generator::indent(&this->super_t_generator,out);
          poVar4 = std::operator<<(poVar4,"<xsd:attribute name=\"");
          pptVar5 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_178);
          psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
          poVar4 = std::operator<<(poVar4,(string *)psVar6);
          poVar4 = std::operator<<(poVar4,"\" type=\"");
          pptVar5 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_178);
          ptVar7 = t_field::get_type(*pptVar5);
          type_name_abi_cxx11_(&local_1a8,this,ptVar7);
          poVar4 = std::operator<<(poVar4,(string *)&local_1a8);
          poVar4 = std::operator<<(poVar4,"\" />");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_1a8);
          __gnu_cxx::
          __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
          operator++(&local_178);
        }
      }
      t_generator::indent_down(&this->super_t_generator);
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      poVar4 = std::operator<<(poVar4,"</xsd:complexType>");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    t_generator::indent_down(&this->super_t_generator);
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    poVar4 = std::operator<<(poVar4,"</xsd:element>");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string((string *)(snillable.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void t_xsd_generator::generate_element(ostream& out,
                                       string name,
                                       t_type* ttype,
                                       t_struct* attrs,
                                       bool optional,
                                       bool nillable,
                                       bool list_element) {
  string sminOccurs = (optional || list_element) ? " minOccurs=\"0\"" : "";
  string smaxOccurs = list_element ? " maxOccurs=\"unbounded\"" : "";
  string soptional = sminOccurs + smaxOccurs;
  string snillable = nillable ? " nillable=\"true\"" : "";

  if (ttype->is_void() || ttype->is_list()) {
    indent(out) << "<xsd:element name=\"" << name << "\"" << soptional << snillable << ">" << endl;
    indent_up();
    if (attrs == nullptr && ttype->is_void()) {
      indent(out) << "<xsd:complexType />" << endl;
    } else {
      indent(out) << "<xsd:complexType>" << endl;
      indent_up();
      if (ttype->is_list()) {
        indent(out) << "<xsd:sequence minOccurs=\"0\" maxOccurs=\"unbounded\">" << endl;
        indent_up();
        string subname;
        t_type* subtype = ((t_list*)ttype)->get_elem_type();
        if (subtype->is_base_type() || subtype->is_container()) {
          subname = name + "_elt";
        } else {
          subname = type_name(subtype);
        }
        f_php_ << "$GLOBALS['" << program_->get_name() << "_xsd_elt_" << name << "'] = '" << subname
               << "';" << endl;
        generate_element(out, subname, subtype, nullptr, false, false, true);
        indent_down();
        indent(out) << "</xsd:sequence>" << endl;
        indent(out) << "<xsd:attribute name=\"list\" type=\"xsd:boolean\" />" << endl;
      }
      if (attrs != nullptr) {
        const vector<t_field*>& members = attrs->get_members();
        vector<t_field*>::const_iterator a_iter;
        for (a_iter = members.begin(); a_iter != members.end(); ++a_iter) {
          indent(out) << "<xsd:attribute name=\"" << (*a_iter)->get_name() << "\" type=\""
                      << type_name((*a_iter)->get_type()) << "\" />" << endl;
        }
      }
      indent_down();
      indent(out) << "</xsd:complexType>" << endl;
    }
    indent_down();
    indent(out) << "</xsd:element>" << endl;
  } else {
    if (attrs == nullptr) {
      indent(out) << "<xsd:element name=\"" << name << "\""
                  << " type=\"" << type_name(ttype) << "\"" << soptional << snillable << " />"
                  << endl;
    } else {
      // Wow, all this work for a SIMPLE TYPE with attributes?!?!?!
      indent(out) << "<xsd:element name=\"" << name << "\"" << soptional << snillable << ">"
                  << endl;
      indent_up();
      indent(out) << "<xsd:complexType>" << endl;
      indent_up();
      indent(out) << "<xsd:complexContent>" << endl;
      indent_up();
      indent(out) << "<xsd:extension base=\"" << type_name(ttype) << "\">" << endl;
      indent_up();
      const vector<t_field*>& members = attrs->get_members();
      vector<t_field*>::const_iterator a_iter;
      for (a_iter = members.begin(); a_iter != members.end(); ++a_iter) {
        indent(out) << "<xsd:attribute name=\"" << (*a_iter)->get_name() << "\" type=\""
                    << type_name((*a_iter)->get_type()) << "\" />" << endl;
      }
      indent_down();
      indent(out) << "</xsd:extension>" << endl;
      indent_down();
      indent(out) << "</xsd:complexContent>" << endl;
      indent_down();
      indent(out) << "</xsd:complexType>" << endl;
      indent_down();
      indent(out) << "</xsd:element>" << endl;
    }
  }
}